

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O2

void memory_region_add_subregion_common
               (MemoryRegion_conflict *mr,hwaddr offset,MemoryRegion_conflict *subregion)

{
  MemoryRegion_conflict *mr_00;
  MemoryRegion *pMVar1;
  QTailQLink *pQVar2;
  undefined1 a [16];
  Int128 IVar3;
  undefined8 in_RAX;
  anon_union_16_2_aaf24f3d_for_subregions_link *paVar4;
  undefined8 unaff_RBX;
  
  if (subregion->container != (MemoryRegion_conflict *)0x0) {
    __assert_fail("!subregion->container",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/softmmu/memory.c"
                  ,0x4dd,
                  "void memory_region_add_subregion_common(MemoryRegion *, hwaddr, MemoryRegion *)")
    ;
  }
  subregion->container = mr;
  subregion->addr = offset;
  IVar3 = subregion->size;
  a._8_8_ = unaff_RBX;
  a._0_8_ = in_RAX;
  int128_get64((Int128)a);
  subregion->end = offset + (long)IVar3;
  mr_00 = subregion->container;
  paVar4 = (anon_union_16_2_aaf24f3d_for_subregions_link *)&mr_00->subregions;
  do {
    pMVar1 = paVar4->tqe_next;
    if (pMVar1 == (MemoryRegion *)0x0) {
      (subregion->subregions_link).tqe_next = (MemoryRegion *)0x0;
      pQVar2 = (mr_00->subregions).tqh_circ.tql_prev;
      (subregion->subregions_link).tqe_circ.tql_prev = pQVar2;
      pQVar2->tql_next = subregion;
      (mr_00->subregions).tqh_circ.tql_prev = (QTailQLink *)&subregion->subregions_link;
LAB_00b12b37:
      mr_00->uc->memory_region_update_pending = true;
      memory_region_transaction_commit_tricore(mr_00);
      return;
    }
    if (pMVar1->priority <= subregion->priority) {
      (subregion->subregions_link).tqe_circ.tql_prev = (pMVar1->subregions_link).tqe_circ.tql_prev;
      (subregion->subregions_link).tqe_next = pMVar1;
      ((pMVar1->subregions_link).tqe_circ.tql_prev)->tql_next = subregion;
      (pMVar1->subregions_link).tqe_circ.tql_prev = (QTailQLink *)&subregion->subregions_link;
      goto LAB_00b12b37;
    }
    paVar4 = &pMVar1->subregions_link;
  } while( true );
}

Assistant:

static void memory_region_add_subregion_common(MemoryRegion *mr,
                                               hwaddr offset,
                                               MemoryRegion *subregion)
{
    assert(!subregion->container);
    subregion->container = mr;
    subregion->addr = offset;
    subregion->end = offset + int128_get64(subregion->size);
    memory_region_update_container_subregions(subregion);
}